

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QUrl QFileDialog::getOpenFileUrl
               (QWidget *parent,QString *caption,QUrl *dir,QString *filter,QString *selectedFilter,
               Options options,QStringList *supportedSchemes)

{
  bool bVar1;
  int iVar2;
  QFileDialog *pQVar3;
  QFileDialog *in_RCX;
  QString *in_RDX;
  QString *in_RSI;
  QFileDialogArgs *in_RDI;
  QFileDialog *in_R8;
  QFileDialog *in_R9;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  int execResult;
  QAutoPointer<QFileDialog> dialog;
  QFileDialogArgs args;
  QFileDialog *in_stack_fffffffffffffef8;
  QFileDialogArgs *url;
  QFileDialogArgs *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QFileDialogArgs *this;
  undefined1 local_70 [8];
  QString aQStack_68 [2];
  QString QStack_30;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_stack_00000008;
  url = in_RDI;
  this = in_RDI;
  memset(local_70,0xaa,0x60);
  QFileDialogArgs::QFileDialogArgs(in_stack_ffffffffffffff10,(QUrl *)url);
  QString::operator=(aQStack_68,in_RDX);
  QString::operator=(&QStack_30,(QString *)in_R8);
  local_18 = 1;
  local_14 = local_c;
  operator_new(0x28);
  QFileDialog(in_R9,(QFileDialogArgs *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
             );
  QAutoPointer<QFileDialog>::QAutoPointer
            ((QAutoPointer<QFileDialog> *)in_RDI,in_stack_fffffffffffffef8);
  QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x759c34);
  setSupportedSchemes((QFileDialog *)in_RDI,(QStringList *)in_stack_fffffffffffffef8);
  if ((in_R9 != (QFileDialog *)0x0) && (bVar1 = QString::isEmpty((QString *)0x759c56), !bVar1)) {
    QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x759c67);
    selectNameFilter((QFileDialog *)this,in_RSI);
  }
  pQVar3 = QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x759c81);
  iVar2 = (**(code **)(*(long *)&(pQVar3->super_QDialog).super_QWidget + 0x1a8))();
  bVar1 = QAutoPointer::operator_cast_to_bool((QAutoPointer<QFileDialog> *)0x759c9e);
  if ((bVar1) && (iVar2 == 1)) {
    if (in_R9 != (QFileDialog *)0x0) {
      QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x759cc3);
      selectedNameFilter(in_RCX);
      QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffef8);
      QString::~QString((QString *)0x759ce9);
    }
    QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x759cf6);
    selectedUrls(in_R8);
    QList<QUrl>::value((QList<QUrl> *)in_R8,(qsizetype)in_R9);
    QList<QUrl>::~QList((QList<QUrl> *)0x759d20);
  }
  else {
    QUrl::QUrl((QUrl *)in_RDI);
  }
  QAutoPointer<QFileDialog>::~QAutoPointer((QAutoPointer<QFileDialog> *)in_RDI);
  QFileDialogArgs::~QFileDialogArgs(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QUrl)(QUrlPrivate *)url;
}

Assistant:

QUrl QFileDialog::getOpenFileUrl(QWidget *parent,
                                 const QString &caption,
                                 const QUrl &dir,
                                 const QString &filter,
                                 QString *selectedFilter,
                                 Options options,
                                 const QStringList &supportedSchemes)
{
    QFileDialogArgs args(dir);
    args.parent = parent;
    args.caption = caption;
    args.filter = filter;
    args.mode = ExistingFile;
    args.options = options;

    QAutoPointer<QFileDialog> dialog(new QFileDialog(args));
    dialog->setSupportedSchemes(supportedSchemes);
    if (selectedFilter && !selectedFilter->isEmpty())
        dialog->selectNameFilter(*selectedFilter);
    const int execResult = dialog->exec();
    if (bool(dialog) && execResult == QDialog::Accepted) {
        if (selectedFilter)
            *selectedFilter = dialog->selectedNameFilter();
        return dialog->selectedUrls().value(0);
    }
    return QUrl();
}